

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O0

void __thiscall
Pass1::error<Format<std::__cxx11::string,std::__cxx11::string>>
          (Pass1 *this,Expression *expression,
          Format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *t)

{
  char *path;
  size_t source_position;
  Printer local_28;
  Format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  Format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *t_local;
  Expression *expression_local;
  Pass1 *this_local;
  
  local_20 = t;
  t_local = (Format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)expression;
  expression_local = (Expression *)this;
  Printer::Printer(&local_28,(ostream *)&std::cerr);
  path = Function::get_path(this->key->old_function);
  source_position = Expression::get_position((Expression *)t_local);
  print_error<Format<std::__cxx11::string,std::__cxx11::string>>
            (&local_28,path,source_position,local_20);
  exit(1);
}

Assistant:

[[noreturn]] void error(const Expression& expression, const T& t) {
		print_error(Printer(std::cerr), key.old_function->get_path(), expression.get_position(), t);
		std::exit(EXIT_FAILURE);
	}